

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTF2Exporter::glTF2Exporter
          (glTF2Exporter *this,char *filename,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *pProperties,bool isBinary)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<glTF2::Asset> *this_00;
  element_type *peVar2;
  aiNode *n;
  Asset *this_01;
  Ref<glTF2::Buffer> RVar3;
  AssetWriter writer;
  AssetWriter AStack_98;
  
  this->mFilename = filename;
  this->mIOSystem = pIOSystem;
  this->mProperties = pProperties;
  p_Var1 = &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mScene = pScene;
  this_01 = (Asset *)operator_new(0xa10);
  glTF2::Asset::Asset(this_01,pIOSystem);
  this_00 = &this->mAsset;
  std::__shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>::reset<glTF2::Asset>
            (&this_00->super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>,this_01);
  if ((isBinary) &&
     (peVar2 = (this_00->super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     (peVar2->mBodyBuffer).vector ==
     (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0)) {
    RVar3 = glTF2::LazyDict<glTF2::Buffer>::Create(&peVar2->buffers,"binary_glTF");
    (peVar2->mBodyBuffer).vector = RVar3.vector;
    (peVar2->mBodyBuffer).index = RVar3.index;
    ((RVar3.vector)->super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[RVar3.index]->mIsSpecial = true;
  }
  ExportMetadata(this);
  ExportMaterials(this);
  n = this->mScene->mRootNode;
  if (n != (aiNode *)0x0) {
    ExportNodeHierarchy(this,n);
  }
  ExportMeshes(this);
  MergeMeshes(this);
  ExportScene(this);
  ExportAnimations(this);
  glTF2::AssetWriter::AssetWriter
            (&AStack_98,
             (this_00->super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (isBinary) {
    glTF2::AssetWriter::WriteGLBFile(&AStack_98,filename);
  }
  else {
    glTF2::AssetWriter::WriteFile(&AStack_98,filename);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&AStack_98.mDoc);
  return;
}

Assistant:

glTF2Exporter::glTF2Exporter(const char* filename, IOSystem* pIOSystem, const aiScene* pScene,
                           const ExportProperties* pProperties, bool isBinary)
    : mFilename(filename)
    , mIOSystem(pIOSystem)
    , mProperties(pProperties)
{
    mScene = pScene;

    mAsset.reset( new Asset( pIOSystem ) );

    if (isBinary) {
        mAsset->SetAsBinary();
    }

    ExportMetadata();

    ExportMaterials();

    if (mScene->mRootNode) {
        ExportNodeHierarchy(mScene->mRootNode);
    }

    ExportMeshes();
    MergeMeshes();

    ExportScene();

    ExportAnimations();

    AssetWriter writer(*mAsset);

    if (isBinary) {
        writer.WriteGLBFile(filename);
    } else {
        writer.WriteFile(filename);
    }
}